

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_receiver.c
# Opt level: O2

int messagereceiver_send_message_disposition
              (MESSAGE_RECEIVER_HANDLE message_receiver,char *link_name,
              delivery_number message_number,AMQP_VALUE delivery_state)

{
  int iVar1;
  char *in_RAX;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  char *my_name;
  
  if (message_receiver == (MESSAGE_RECEIVER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x1e1;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x1e1;
    }
    pcVar4 = "NULL message_receiver";
    iVar3 = 0x1e0;
  }
  else if (message_receiver->message_receiver_state == MESSAGE_RECEIVER_STATE_OPEN) {
    my_name = in_RAX;
    iVar1 = link_get_name(message_receiver->link,&my_name);
    if (iVar1 == 0) {
      iVar1 = strcmp(link_name,my_name);
      if (iVar1 == 0) {
        iVar1 = link_send_disposition(message_receiver->link,message_number,delivery_state);
        if (iVar1 == 0) {
          return 0;
        }
        p_Var2 = xlogging_get_log_function();
        iVar1 = 0x1fe;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0x1fe;
        }
        pcVar4 = "Seding disposition failed";
        iVar3 = 0x1fd;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        iVar1 = 0x1f7;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0x1f7;
        }
        pcVar4 = "Link name does not match";
        iVar3 = 0x1f6;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x1f0;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0x1f0;
      }
      pcVar4 = "Failed getting link name";
      iVar3 = 0x1ef;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x1e8;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x1e8;
    }
    pcVar4 = "Message received not open";
    iVar3 = 0x1e7;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
            ,"messagereceiver_send_message_disposition",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

int messagereceiver_send_message_disposition(MESSAGE_RECEIVER_HANDLE message_receiver, const char* link_name, delivery_number message_number, AMQP_VALUE delivery_state)
{
    int result;

    if (message_receiver == NULL)
    {
        LogError("NULL message_receiver");
        result = MU_FAILURE;
    }
    else
    {
        if (message_receiver->message_receiver_state != MESSAGE_RECEIVER_STATE_OPEN)
        {
            LogError("Message received not open");
            result = MU_FAILURE;
        }
        else
        {
            const char* my_name;
            if (link_get_name(message_receiver->link, &my_name) != 0)
            {
                LogError("Failed getting link name");
                result = MU_FAILURE;
            }
            else
            {
                if (strcmp(link_name, my_name) != 0)
                {
                    LogError("Link name does not match");
                    result = MU_FAILURE;
                }
                else
                {
                    if (link_send_disposition(message_receiver->link, message_number, delivery_state) != 0)
                    {
                        LogError("Seding disposition failed");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}